

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

bool duckdb::IndexScanPercentageSetting::OnGlobalSet
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  InvalidInputException *this;
  double dVar1;
  allocator local_39;
  string local_38;
  
  dVar1 = Value::GetValue<double>(input);
  if ((0.0 <= dVar1) && (dVar1 <= 1.0)) {
    return true;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"the index scan percentage must be within [0, 1]",&local_39);
  InvalidInputException::InvalidInputException(this,&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool IndexScanPercentageSetting::OnGlobalSet(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto index_scan_percentage = input.GetValue<double>();
	if (index_scan_percentage < 0 || index_scan_percentage > 1.0) {
		throw InvalidInputException("the index scan percentage must be within [0, 1]");
	}
	return true;
}